

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

ssize_t __thiscall Hpipe::Lexer::read(Lexer *this,int __fd,void *__buf,size_t __nbytes)

{
  Lexem *pLVar1;
  ErrorList *this_00;
  bool bVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  int num_grp;
  long lVar6;
  Lexem *pLVar7;
  undefined4 in_register_00000034;
  Source *source;
  char *cur;
  Lexem **ppLVar8;
  Lexem *pLVar9;
  char *__end;
  bool bVar10;
  string local_c8;
  Lexem *local_a8;
  Lexem **local_a0;
  string local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  
  source = (Source *)CONCAT44(in_register_00000034,__fd);
  pLVar7 = &this->first_item;
  do {
    pLVar9 = pLVar7;
    pLVar7 = pLVar9->next;
  } while (pLVar9->next != (Lexem *)0x0);
  this->last = pLVar9;
  this->sibling[0] = (Lexem *)0x0;
  this->sibling[1] = (Lexem *)0x0;
  this->sibling[2] = (Lexem *)0x0;
  this->sibling[3] = (Lexem *)0x0;
  this->sibling[4] = (Lexem *)0x0;
  this->sibling[5] = (Lexem *)0x0;
  this->sibling[6] = (Lexem *)0x0;
  this->sibling[7] = (Lexem *)0x0;
  this->sibling[8] = (Lexem *)0x0;
  this->sibling[9] = (Lexem *)0x0;
  this->sibling[10] = (Lexem *)0x0;
  this->sibling[0xb] = (Lexem *)0x0;
  this->sibling[0xc] = (Lexem *)0x0;
  this->sibling[0xd] = (Lexem *)0x0;
  this->sibling[0xe] = (Lexem *)0x0;
  this->sibling[0xf] = (Lexem *)0x0;
  cur = source->data;
  local_a8 = pLVar9;
  if (cur == (char *)0x0) {
    this_00 = this->error_list;
    std::__cxx11::string::string((string *)&local_c8,source->provenance,(allocator *)&local_98);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x17fc94);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_68 = *plVar5;
      lStack_60 = plVar4[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar5;
      local_78 = (long *)*plVar4;
    }
    local_70 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ErrorList::add(this_00,source,(char *)0x0,(char *)local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    do {
      iVar3 = read_tok(this,source,cur);
      cur = cur + iVar3;
    } while (iVar3 != 0);
    lStack_60 = 0x100000002;
    local_68 = 0x300000003;
    local_70 = 0x100000003;
    local_78 = (long *)0x1;
    lVar6 = 0xf;
    do {
      pLVar7 = this->sibling[lVar6];
      if (pLVar7 != (Lexem *)0x0) {
        iVar3 = *(int *)((long)&local_78 + lVar6 * 4);
        do {
          if (iVar3 == 3) {
            assemble_barg(this,pLVar7,1,1);
          }
          else if (iVar3 == 2) {
            assemble_rarg(this,pLVar7);
          }
          else if (iVar3 == 1) {
            assemble_larg(this,pLVar7);
          }
          pLVar7 = pLVar7->sibling;
        } while (pLVar7 != (Lexem *)0x0);
      }
      bVar10 = lVar6 != 0;
      lVar6 = lVar6 + -1;
    } while (bVar10);
    pLVar7 = local_a8;
    do {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"=","");
      bVar10 = Lexem::eq(pLVar7,OPERATOR,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (bVar10) {
        ppLVar8 = &pLVar7->next;
        local_a0 = ppLVar8;
        while( true ) {
          pLVar9 = *ppLVar8;
          bVar10 = true;
          if (pLVar9 != (Lexem *)0x0) {
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"=","");
            bVar2 = Lexem::eq(pLVar9,OPERATOR,&local_98);
            if (!bVar2) {
              bVar10 = (pLVar9->type - TRAINING & 0xfffffffa) == 0;
            }
          }
          if ((pLVar9 != (Lexem *)0x0) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2)) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if (bVar10) break;
          ppLVar8 = &pLVar9->next;
        }
        pLVar1 = *local_a0;
        if (pLVar9 != pLVar1) {
          pLVar7->children[1] = pLVar1;
          pLVar1->parent = pLVar7;
          pLVar1->prev = (Lexem *)0x0;
          if (pLVar9 != (Lexem *)0x0) {
            pLVar9->prev->next = (Lexem *)0x0;
            pLVar9->prev = pLVar7;
          }
          *local_a0 = pLVar9;
        }
      }
      pLVar7 = pLVar7->next;
    } while (pLVar7 != (Lexem *)0x0);
    pLVar9 = local_a8->next;
  }
  return (ssize_t)pLVar9;
}

Assistant:

Lexem *Lexer::read( Source *source ) {
    // init
    last = &first_item;
    while ( last->next )
        last = last->next;
    Lexem *res = last;

    for( int i = 0; i < max_op_grp; ++i )
        sibling[ i ] = 0;

    // tokenize
    const char *data = source->data;
    if ( not data ) {
        error_list.add( source, 0, ( "Impossible to open " + std::string( source->provenance ) ).c_str() );
        return res;
    }

    while ( int inc = read_tok( source, data ) )
        data += inc;

    // operators
    enum { need_none = 0, need_larg = 1, need_rarg = 2, need_barg = 3 };
    int behavior[ max_op_grp ];
    #define OPERATOR( S, N, G ) behavior[ G ] = N;
    #include "Operators.h"
    #undef OPERATOR

    for( int num_grp = max_op_grp - 1; num_grp >= 0; --num_grp ) {
        for( Lexem *item = sibling[ num_grp ]; item; item = item->sibling ) {
            switch( behavior[ num_grp ] ) {
            case need_none: break;
            case need_larg: assemble_larg( item ); break;
            case need_rarg: assemble_rarg( item ); break;
            case need_barg: assemble_barg( item ); break;
            }
        }
    }

    // assemble machines
    for( Lexem *item = res; item; item = item->next ) {
        if ( item->eq( Lexem::OPERATOR, "=" ) ) {
            for( Lexem *next = item->next; ; next = next->next ) {
                if ( not next or next->eq( Lexem::OPERATOR, "=" ) or next->type == Lexem::TEST or next->type == Lexem::TRAINING or next->type == Lexem::METHODS or next->type == Lexem::FLAGS ) {
                    if ( next != item->next ) {
                        item->children[ 1 ] = item->next;
                        item->next->parent = item;
                        item->next->prev = 0;
                        if ( next ) {
                            next->prev->next = 0;
                            next->prev = item;
                        }
                        item->next = next;
                    }
                    break;
                }
            }
        }
    }

    return res->next;
}